

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O3

wchar_t rd_dungeon(void)

{
  chunk_conflict *c;
  player *p;
  undefined8 in_RAX;
  loc_conflict grid;
  char *pcVar1;
  wchar_t wVar2;
  uint16_t depth;
  uint16_t px;
  uint16_t py;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  rd_u16b((uint16_t *)((long)&uStack_28 + 2));
  rd_u16b(&daycount);
  rd_u16b((uint16_t *)((long)&uStack_28 + 6));
  rd_u16b((uint16_t *)((long)&uStack_28 + 4));
  rd_byte(&square_size);
  wVar2 = L'\0';
  if (player->is_dead == false) {
    if (uStack_28._2_2_ < z_info->max_depth) {
      rd_dungeon_aux((chunk **)&cave);
      p = player;
      c = cave;
      if (((int)(uint)uStack_28._4_2_ < cave->width) && ((int)(uint)uStack_28._6_2_ < cave->height))
      {
        player->depth = uStack_28._2_2_;
        c->depth = (uint)uStack_28._2_2_;
        grid = loc((uint)uStack_28._4_2_,(uint)uStack_28._6_2_);
        player_place((chunk_conflict2 *)c,p,grid);
        character_dungeon = true;
        rd_dungeon_aux((chunk **)&player->cave);
        player->cave->depth = (uint)uStack_28._2_2_;
        wVar2 = L'\0';
      }
      else {
        pcVar1 = format("Ignoring illegal player location (%d,%d).");
        note(pcVar1);
        wVar2 = L'\x01';
      }
    }
    else {
      wVar2 = L'\0';
      pcVar1 = format("Ignoring illegal dungeon depth (%d)");
      note(pcVar1);
    }
  }
  return wVar2;
}

Assistant:

int rd_dungeon(void)
{
	uint16_t depth;
	uint16_t py, px;

	/* Header info */
	rd_u16b(&depth);
	rd_u16b(&daycount);
	rd_u16b(&py);
	rd_u16b(&px);
	rd_byte(&square_size);

	/* Only if the player's alive */
	if (player->is_dead)
		return 0;

	/* Ignore illegal dungeons */
	if (depth >= z_info->max_depth) {
		note(format("Ignoring illegal dungeon depth (%d)", depth));
		return (0);
	}

	if (rd_dungeon_aux(&cave))
		return 1;

	/* Ignore illegal dungeons */
	if ((px >= cave->width) || (py >= cave->height)) {
		note(format("Ignoring illegal player location (%d,%d).", py, px));
		return (1);
	}

	/* Load player depth */
	player->depth = depth;
	cave->depth = depth;

	/* Place player in dungeon */
	player_place(cave, player, loc(px, py));

	/* The dungeon is ready */
	character_dungeon = true;

	/* Read known cave */
	if (rd_dungeon_aux(&player->cave)) {
		return 1;
	}
	player->cave->depth = depth;

	return 0;
}